

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_event_handler.c
# Opt level: O1

void pcp_flow_updated(pcp_flow_t *f)

{
  pcp_server_t *ppVar1;
  timeval curtime;
  timeval local_18;
  
  if (f != (pcp_flow_t *)0x0) {
    gettimeofday(&local_18,(__timezone_ptr_t)0x0);
    ppVar1 = get_pcp_server(f->ctx,f->pcp_server_indx);
    if (ppVar1 != (pcp_server_t *)0x0) {
      (ppVar1->next_timeout).tv_sec = local_18.tv_sec;
      (ppVar1->next_timeout).tv_usec = local_18.tv_usec;
    }
    pcp_flow_clear_msg_buf(f);
    (f->timeout).tv_sec = local_18.tv_sec;
    (f->timeout).tv_usec = local_18.tv_usec;
    if ((7 < (uint)f->state) || ((0x83U >> (f->state & 0x1f) & 1) == 0)) {
      f->state = pfs_send;
    }
  }
  return;
}

Assistant:

void pcp_flow_updated(pcp_flow_t *f) {
    struct timeval curtime;
    pcp_server_t *s;

    if (!f)
        return;

    gettimeofday(&curtime, NULL);
    s = get_pcp_server(f->ctx, f->pcp_server_indx);
    if (s) {
        s->next_timeout = curtime;
    }
    pcp_flow_clear_msg_buf(f);
    f->timeout = curtime;
    if ((f->state != pfs_wait_for_server_init) && (f->state != pfs_idle) &&
        (f->state != pfs_failed)) {
        f->state = pfs_send;
    }
}